

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::JsonUnitTestResultPrinter::OnTestIterationEnd
          (JsonUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  FILE *__stream;
  ostream *poVar2;
  string *pathname;
  GTestLog local_208 [2];
  stringstream stream;
  ostream local_1f8 [376];
  string local_80;
  undefined1 local_60 [8];
  FilePath output_file;
  FilePath output_dir;
  
  pathname = &this->output_file_;
  FilePath::FilePath((FilePath *)local_60,pathname);
  FilePath::RemoveFileName
            ((FilePath *)((long)&output_file.pathname_.field_2 + 8),(FilePath *)local_60);
  bVar1 = FilePath::CreateDirectoriesRecursively
                    ((FilePath *)((long)&output_file.pathname_.field_2 + 8));
  if (bVar1) {
    __stream = fopen((pathname->_M_dataplus)._M_p,"w");
    if (__stream != (FILE *)0x0) goto LAB_00162b6e;
  }
  GTestLog::GTestLog(local_208,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/gtest/googletest/src/gtest.cc"
                     ,0xf4e);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Unable to open file \"");
  poVar2 = std::operator<<(poVar2,(string *)pathname);
  std::operator<<(poVar2,"\"");
  GTestLog::~GTestLog(local_208);
  __stream = (FILE *)0x0;
LAB_00162b6e:
  std::__cxx11::stringstream::stringstream((stringstream *)local_208);
  PrintJsonUnitTest(local_1f8,unit_test);
  StringStreamToString(&local_80,(stringstream *)local_208);
  fputs(local_80._M_dataplus._M_p,__stream);
  std::__cxx11::string::~string((string *)&local_80);
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
  std::__cxx11::string::~string((string *)(output_file.pathname_.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* jsonout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    jsonout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (jsonout == NULL) {
    // TODO(phosek): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.
    GTEST_LOG_(FATAL) << "Unable to open file \""
                      << output_file_ << "\"";
  }
  std::stringstream stream;
  PrintJsonUnitTest(&stream, unit_test);
  fprintf(jsonout, "%s", StringStreamToString(&stream).c_str());
  fclose(jsonout);
}